

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_dpb.c
# Opt level: O1

MPP_RET avs2d_dpb_flush(Avs2dCtx_t *p_dec)

{
  Avs2dFrame_t *pAVar1;
  MPP_RET MVar2;
  undefined8 in_RAX;
  ulong uVar3;
  
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","avs2d_dpb_flush");
  }
  if ((p_dec->frm_mgr).dpb_size != 0) {
    uVar3 = 0;
    do {
      pAVar1 = (p_dec->frm_mgr).dpb[uVar3];
      if (pAVar1->slot_idx != -1) {
        if (pAVar1 == (Avs2dFrame_t *)0x0) {
          in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),0x174);
          _mpp_log_l(2,"avs2d_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,"p","unmark_refered"
                     ,in_RAX);
          if ((mpp_debug._3_1_ & 0x10) != 0) {
            abort();
          }
        }
        pAVar1->refered_by_others = '\0';
        pAVar1->refered_by_scene = '\0';
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (p_dec->frm_mgr).dpb_size);
  }
  dpb_remove_unused_frame(p_dec);
  do {
    MVar2 = MPP_OK;
    if ((p_dec->frm_mgr).used_size == 0) break;
    MVar2 = dpb_output_next_frame(p_dec,0);
  } while (MVar2 == MPP_OK);
  (p_dec->frm_mgr).num_of_ref = '\0';
  (p_dec->frm_mgr).prev_doi = -1;
  (p_dec->frm_mgr).output_poi = -1;
  (p_dec->frm_mgr).tr_wrap_cnt = 0;
  (p_dec->frm_mgr).used_size = 0;
  (p_dec->frm_mgr).refs[0] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[1] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[2] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[3] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[4] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[5] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[6] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).scene_ref = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).cur_frm = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).cur_rps.ref_pic[0] = '\0';
  (p_dec->frm_mgr).cur_rps.ref_pic[1] = '\0';
  (p_dec->frm_mgr).cur_rps.ref_pic[2] = '\0';
  (p_dec->frm_mgr).cur_rps.ref_pic[3] = '\0';
  (p_dec->frm_mgr).cur_rps.ref_pic[4] = '\0';
  (p_dec->frm_mgr).cur_rps.ref_pic[5] = '\0';
  (p_dec->frm_mgr).cur_rps.ref_pic[6] = '\0';
  (p_dec->frm_mgr).cur_rps.remove_pic[0] = '\0';
  *(undefined8 *)((p_dec->frm_mgr).cur_rps.remove_pic + 1) = 0;
  (p_dec->frm_mgr).cur_rps.num_to_remove = '\0';
  (p_dec->frm_mgr).cur_rps.refered_by_others = '\0';
  *(undefined2 *)&(p_dec->frm_mgr).cur_rps.field_0x12 = 0;
  (p_dec->frm_mgr).cur_rps.reserved = 0;
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out.","avs2d_dpb_flush");
  }
  return MVar2;
}

Assistant:

MPP_RET avs2d_dpb_flush(Avs2dCtx_t *p_dec)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i;
    Avs2dFrame_t *p;
    Avs2dFrameMgr_t *mgr = &p_dec->frm_mgr;

    AVS2D_PARSE_TRACE("In.");
    //!< unmark all frames refered flag
    for (i = 0; i < mgr->dpb_size; i++) {
        p = mgr->dpb[i];
        if (p->slot_idx != NO_VAL) {
            unmark_refered(p);
        }
    }

    //!< remove all unused frame
    dpb_remove_unused_frame(p_dec);

    //!< output frames in POI order
    while (mgr->used_size) {
        if ((ret = dpb_output_next_frame(p_dec, 0)) != MPP_OK) {
            break;
        }
    }

    //!< reset dpb management
    dpb_init_management(mgr);

    AVS2D_PARSE_TRACE("Out.");
    return ret;
}